

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::combineOr(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Binary *curr_00;
  int *piVar2;
  Expression *pEVar3;
  Const *pCVar4;
  bool bVar5;
  bool bVar6;
  Id IVar7;
  undefined8 extraout_RAX;
  undefined7 extraout_var;
  Binary *pBVar8;
  ulong uVar9;
  EffectAnalyzer local_3d0;
  EffectAnalyzer local_260;
  Const **local_f0;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_e0;
  anon_union_16_5_9943fe1e_for_Literal_0 local_b0;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_a0;
  Literal local_70;
  uintptr_t local_58;
  OptimizeInstructions *local_50;
  HeapType local_48;
  Const *cy;
  Const *cx;
  
  local_50 = this;
  if (curr->op != OrInt32) {
    __assert_fail("curr->op == OrInt32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xc5e,"Expression *wasm::OptimizeInstructions::combineOr(Binary *)");
  }
  pBVar8 = (Binary *)0x0;
  if ((((Binary *)curr->left)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
      _id == BinaryId) {
    pBVar8 = (Binary *)curr->left;
  }
  if ((pBVar8 != (Binary *)0x0) && (pEVar1 = curr->right, pEVar1->_id == BinaryId)) {
    if ((pBVar8->op == pEVar1[1]._id) ||
       ((bVar5 = ExpressionAnalyzer::equal(pBVar8->left,(Expression *)pEVar1[1].type.id), !bVar5 ||
        (bVar5 = ExpressionAnalyzer::equal(pBVar8->right,*(Expression **)(pEVar1 + 2)), !bVar5)))) {
      bVar5 = false;
LAB_00807268:
      bVar6 = false;
      uVar9 = 0;
    }
    else {
      EffectAnalyzer::EffectAnalyzer
                (&local_260,
                 &((local_50->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (local_50->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,pBVar8->left);
      bVar5 = true;
      if ((((((local_260.trap != false) ||
             (local_260.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
            (local_260.danglingPop != false)) ||
           (((local_260.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
             (local_260.writesMemory != false)) ||
            ((local_260.writesTable != false ||
             ((local_260.writesStruct != false || (local_260.writesArray != false)))))))) ||
          (local_260.isAtomic != false)) ||
         ((((local_260.calls != false || (local_260.throws_ != false)) ||
           (local_260.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
          (bVar6 = false, local_260.branchesOut != false)))) goto LAB_00807268;
      uVar9 = 0;
      if (local_260.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        EffectAnalyzer::EffectAnalyzer
                  (&local_3d0,
                   &((local_50->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).super_Pass.runner)->options,
                   (local_50->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currModule,pBVar8->right);
        bVar6 = true;
        uVar9 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        if (local_3d0.trap == false) {
          bVar5 = EffectAnalyzer::hasNonTrapSideEffects(&local_3d0);
          uVar9 = CONCAT71(extraout_var,bVar5);
        }
        uVar9 = uVar9 & 0xffffffff ^ 1;
        bVar5 = true;
      }
    }
    if (bVar6) {
      cx = (Const *)CONCAT44(cx._4_4_,(int)uVar9);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3d0.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3d0.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3d0.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_3d0.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_3d0.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_3d0.localsRead._M_t);
      if (local_3d0.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3d0.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      uVar9 = (ulong)cx & 0xffffffff;
    }
    if (bVar5) {
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_260.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_260.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_260.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_260.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_260.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_260.localsRead._M_t);
      if (local_260.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_260.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    if ((((char)uVar9 != '\0') && (pBVar8->op == EqInt32)) && (pEVar1[1]._id == MemoryGrowId)) {
      pBVar8->op = GeSInt32;
      return (Expression *)pBVar8;
    }
  }
  curr_00 = (Binary *)curr->left;
  local_e0.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_e0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_f0 = &cy;
  if (((curr_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
       BinaryId) &&
     (cy = (Const *)curr_00->right,
     (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)) {
    cx = (Const *)curr_00->left;
    Literal::Literal((Literal *)&local_b0.func,&cy->value);
    bVar5 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(&local_e0,
                      (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                      &local_b0.func);
    Literal::~Literal((Literal *)&local_b0.func);
    if (bVar5) {
      pEVar1 = curr->right;
      local_a0.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_a0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
      local_b0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_48;
      if ((pEVar1->_id == BinaryId) && (piVar2 = *(int **)(pEVar1 + 2), *piVar2 == 0xe)) {
        local_58 = pEVar1[1].type.id;
        local_48.id = (uintptr_t)piVar2;
        Literal::Literal(&local_70,(Literal *)(piVar2 + 4));
        bVar5 = Match::Internal::
                Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                ::matches(&local_a0,&local_70);
        Literal::~Literal(&local_70);
        if ((bVar5) &&
           (((curr_00->op == pEVar1[1]._id &&
             ((cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id ==
              *(uintptr_t *)(local_58 + 8))) &&
            (bVar5 = Literal::operator==(&cy->value,(Literal *)(local_48.id + 0x10)), bVar5)))) {
          bVar6 = inversesOr(local_50,curr_00);
          pCVar4 = cx;
          bVar5 = true;
          if (bVar6) {
            IVar7 = Abstract::getBinary((Type)(cx->
                                              super_SpecificExpression<(wasm::Expression::Id)14>).
                                              super_Expression.type.id,And);
            pEVar1[1]._id = IVar7;
            (pEVar1->type).id =
                 (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                 id;
            pEVar1[1].type.id = (uintptr_t)pCVar4;
            *(uintptr_t *)(pEVar1 + 2) = local_58;
            curr_00->left = pEVar1;
            bVar5 = false;
            pBVar8 = curr_00;
          }
          goto LAB_008074ce;
        }
      }
    }
  }
  bVar5 = true;
LAB_008074ce:
  local_f0 = &cy;
  if (bVar5) {
    pBVar8 = (Binary *)curr->left;
    local_e0.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_e0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    if (((pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         BinaryId) &&
       (cy = (Const *)pBVar8->right,
       (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)) {
      pEVar1 = pBVar8->left;
      Literal::Literal((Literal *)&local_b0.func,&cy->value);
      bVar5 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches(&local_e0,
                        (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                         *)&local_b0.func);
      Literal::~Literal((Literal *)&local_b0.func);
      if (bVar5) {
        pEVar3 = curr->right;
        local_a0.binder =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_a0.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
        local_b0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_48;
        if ((pEVar3->_id == BinaryId) &&
           (local_48.id = *(uintptr_t *)(pEVar3 + 2), *(int *)local_48.id == 0xe)) {
          cx = (Const *)pEVar3[1].type.id;
          Literal::Literal(&local_70,(Literal *)(local_48.id + 0x10));
          bVar5 = Match::Internal::
                  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches(&local_a0,&local_70);
          Literal::~Literal(&local_70);
          if ((bVar5) &&
             ((((pBVar8->op == pEVar3[1]._id &&
                ((pEVar1->type).id ==
                 (cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id))
               && (bVar5 = Literal::operator==(&cy->value,(Literal *)(local_48.id + 0x10)), bVar5))
              && (bVar5 = preserveOr(local_50,pBVar8), bVar5)))) {
            IVar7 = Abstract::getBinary((Type)(pEVar1->type).id,Or);
            pEVar3[1]._id = IVar7;
            (pEVar3->type).id = (pEVar1->type).id;
            pEVar3[1].type.id = (uintptr_t)pEVar1;
            *(Const **)(pEVar3 + 2) = cx;
            pBVar8->left = pEVar3;
            return (Expression *)pBVar8;
          }
        }
      }
    }
    pBVar8 = (Binary *)0x0;
  }
  return (Expression *)pBVar8;
}

Assistant:

Expression* combineOr(Binary* curr) {
    assert(curr->op == OrInt32);

    using namespace Abstract;
    using namespace Match;

    if (auto* left = curr->left->dynCast<Binary>()) {
      if (auto* right = curr->right->dynCast<Binary>()) {
        if (left->op != right->op &&
            ExpressionAnalyzer::equal(left->left, right->left) &&
            ExpressionAnalyzer::equal(left->right, right->right) &&
            !effects(left->left).hasSideEffects() &&
            !effects(left->right).hasSideEffects()) {
          switch (left->op) {
            //   (x > y) | (x == y)    ==>    x >= y
            case EqInt32: {
              if (right->op == GtSInt32) {
                left->op = GeSInt32;
                return left;
              }
              break;
            }
            default: {
            }
          }
        }
      }
    }
    {
      // Binary operations that inverses a bitwise OR to AND.
      // If F(x) = binary(x, c), and F(x) inverses OR,
      // that is,
      //
      //   F(x) | F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesOr(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise OR can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves OR,
      // that is,
      //
      //   F(x) | F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveOr(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }